

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O2

SRes LzmaEnc_Encode2(CLzmaEnc *p,ICompressProgressPtr progress)

{
  SRes SVar1;
  
  while( true ) {
    SVar1 = LzmaEnc_CodeOneBlock(p,0,0);
    if (SVar1 != 0) {
      return SVar1;
    }
    if (p->finished != 0) break;
    if ((progress != (ICompressProgressPtr)0x0) &&
       (SVar1 = (*progress->Progress)
                          (progress,p->nowPos64,
                           (UInt64)((p->rc).buf +
                                   (p->rc).cacheSize + ((p->rc).processed - (long)(p->rc).bufBase)))
       , SVar1 != 0)) {
      return 10;
    }
  }
  return 0;
}

Assistant:

Z7_NO_INLINE
static SRes LzmaEnc_Encode2(CLzmaEnc *p, ICompressProgressPtr progress)
{
  SRes res = SZ_OK;

  #ifndef Z7_ST
  Byte allocaDummy[0x300];
  allocaDummy[0] = 0;
  allocaDummy[1] = allocaDummy[0];
  #endif

  for (;;)
  {
    res = LzmaEnc_CodeOneBlock(p, 0, 0);
    if (res != SZ_OK || p->finished)
      break;
    if (progress)
    {
      res = ICompressProgress_Progress(progress, p->nowPos64, RangeEnc_GetProcessed(&p->rc));
      if (res != SZ_OK)
      {
        res = SZ_ERROR_PROGRESS;
        break;
      }
    }
  }
  
  LzmaEnc_Finish((CLzmaEncHandle)(void *)p);

  /*
  if (res == SZ_OK && !Inline_MatchFinder_IsFinishedOK(&MFB))
    res = SZ_ERROR_FAIL;
  }
  */

  return res;
}